

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O0

void __thiscall wallet::CKeyMetadata::Unserialize<DataStream>(CKeyMetadata *this,DataStream *s)

{
  CKeyMetadata *in_RDI;
  long in_FS_OFFSET;
  DataStream *s_00;
  
  s_00 = *(DataStream **)(in_FS_OFFSET + 0x28);
  Unser<DataStream>(s_00,in_RDI);
  if (*(DataStream **)(in_FS_OFFSET + 0x28) == s_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CKeyMetadata, obj)
    {
        READWRITE(obj.nVersion, obj.nCreateTime);
        if (obj.nVersion >= VERSION_WITH_HDDATA) {
            READWRITE(obj.hdKeypath, obj.hd_seed_id);
        }
        if (obj.nVersion >= VERSION_WITH_KEY_ORIGIN)
        {
            READWRITE(obj.key_origin);
            READWRITE(obj.has_key_origin);
        }
    }